

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_ffh_string_reverse(lua_State *L)

{
  uint uVar1;
  GCstr *pGVar2;
  void *pvVar3;
  MSize nsz;
  ulong uVar4;
  
  pGVar2 = lj_lib_checkstr(L,1);
  uVar4 = (ulong)(L->glref).ptr32;
  uVar1 = pGVar2->len;
  if (*(uint *)(uVar4 + 100) < uVar1) {
    nsz = 0x20;
    if (0x20 < uVar1) {
      nsz = uVar1;
    }
    pvVar3 = lj_mem_realloc(L,*(void **)(uVar4 + 0x58),*(uint *)(uVar4 + 100),nsz);
    *(void **)(uVar4 + 0x58) = pvVar3;
    *(MSize *)(uVar4 + 100) = nsz;
  }
  return 0;
}

Assistant:

LJLIB_ASM(string_reverse)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  lj_str_needbuf(L, &G(L)->tmpbuf, s->len);
  return FFH_RETRY;
}